

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O1

void __thiscall
KDIS::NETWORK::Connection::RemoveSubscriber(Connection *this,ConnectionSubscriber *S)

{
  pointer ppCVar1;
  pointer __src;
  pointer __dest;
  
  if (S != (ConnectionSubscriber *)0x0) {
    __dest = (this->m_vpSubscribers).
             super__Vector_base<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppCVar1 = (this->m_vpSubscribers).
              super__Vector_base<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (__dest != ppCVar1) {
      do {
        if (*__dest == S) {
          __src = __dest + 1;
          ppCVar1 = (this->m_vpSubscribers).
                    super__Vector_base<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (__src != ppCVar1) {
            memmove(__dest,__src,(long)ppCVar1 - (long)__src);
          }
          ppCVar1 = (this->m_vpSubscribers).
                    super__Vector_base<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1;
          (this->m_vpSubscribers).
          super__Vector_base<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppCVar1;
        }
        else {
          __dest = __dest + 1;
        }
      } while (__dest != ppCVar1);
    }
  }
  return;
}

Assistant:

void Connection::RemoveSubscriber( ConnectionSubscriber * S )
{
    if( S )
    {
        // Perform a linear search for the subscriber.
        vector<ConnectionSubscriber*>::iterator itr = m_vpSubscribers.begin();
        vector<ConnectionSubscriber*>::iterator itrEnd = m_vpSubscribers.end();
        while( itr != itrEnd )
        {
            if( *itr == S )
            {
                // Remove the subsriber
                itr = m_vpSubscribers.erase( itr );
                itrEnd = m_vpSubscribers.end();

                // Now continue searching, the subscriber may have been added twice...
            }
            else
            {
                ++itr;
            }
        }
    }
}